

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

LY_ERR ly_ctx_new_ylmem(char *search_dir,char *data,LYD_FORMAT format,int options,ly_ctx **ctx)

{
  LY_ERR LVar1;
  char *pcVar2;
  lyd_node *node;
  ly_ctx *ctx_yl;
  lyd_node *data_yl;
  ly_ctx *local_48;
  int local_3c;
  lyd_node *local_38;
  
  local_48 = (ly_ctx *)0x0;
  local_38 = (lyd_node *)0x0;
  if (data == (char *)0x0) {
    pcVar2 = "data";
  }
  else {
    if (ctx != (ly_ctx **)0x0) {
      local_3c = options;
      LVar1 = ly_ctx_new(search_dir,0,&local_48);
      node = (lyd_node *)0x0;
      if ((LVar1 == LY_SUCCESS) &&
         (LVar1 = lyd_parse_data_mem(local_48,data,format,0,2,&local_38), node = local_38,
         LVar1 == LY_SUCCESS)) {
        LVar1 = ly_ctx_new_yldata(search_dir,local_38,local_3c,ctx);
        node = local_38;
      }
      lyd_free_all(node);
      ly_ctx_destroy(local_48);
      return LVar1;
    }
    pcVar2 = "ctx";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_ctx_new_ylmem");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_new_ylmem(const char *search_dir, const char *data, LYD_FORMAT format, int options, struct ly_ctx **ctx)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_ctx *ctx_yl = NULL;
    struct lyd_node *data_yl = NULL;

    LY_CHECK_ARG_RET(NULL, data, ctx, LY_EINVAL);

    /* create a seperate context for the data */
    LY_CHECK_GOTO(ret = ly_ctx_new(search_dir, 0, &ctx_yl), cleanup);

    /* parse yang library data tree */
    LY_CHECK_GOTO(ret = lyd_parse_data_mem(ctx_yl, data, format, 0, LYD_VALIDATE_PRESENT, &data_yl), cleanup);

    /* create the new context */
    ret = ly_ctx_new_yldata(search_dir, data_yl, options, ctx);

cleanup:
    lyd_free_all(data_yl);
    ly_ctx_destroy(ctx_yl);
    return ret;
}